

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ExtensionSet::Extension::SerializeMessageSetItemWithCachedSizes
          (Extension *this,int number,CodedOutputStream *output)

{
  MessageLite *value;
  
  if ((this->type == '\v') && (this->is_repeated != true)) {
    if ((this->field_0xa & 1) != 0) {
      return;
    }
    io::CodedOutputStream::WriteVarint32(output,0xb);
    WireFormatLite::WriteUInt32(2,number,output);
    value = (this->field_0).message_value;
    if ((this->field_0xa & 0x10) == 0) {
      WireFormatLite::WriteMessageMaybeToArray(3,value,output);
    }
    else {
      (*value->_vptr_MessageLite[0xd])(value,3,output);
    }
    io::CodedOutputStream::WriteVarint32(output,0xc);
    return;
  }
  SerializeFieldWithCachedSizes(this,number,output);
  return;
}

Assistant:

void ExtensionSet::Extension::SerializeMessageSetItemWithCachedSizes(
    int number,
    io::CodedOutputStream* output) const {
  if (type != WireFormatLite::TYPE_MESSAGE || is_repeated) {
    // Not a valid MessageSet extension, but serialize it the normal way.
    SerializeFieldWithCachedSizes(number, output);
    return;
  }

  if (is_cleared) return;

  // Start group.
  output->WriteTag(WireFormatLite::kMessageSetItemStartTag);

  // Write type ID.
  WireFormatLite::WriteUInt32(WireFormatLite::kMessageSetTypeIdNumber,
                              number,
                              output);
  // Write message.
  if (is_lazy) {
    lazymessage_value->WriteMessage(
        WireFormatLite::kMessageSetMessageNumber, output);
  } else {
    WireFormatLite::WriteMessageMaybeToArray(
        WireFormatLite::kMessageSetMessageNumber,
        *message_value,
        output);
  }

  // End group.
  output->WriteTag(WireFormatLite::kMessageSetItemEndTag);
}